

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

SynForEach * ParseForEach(ParseContext *ctx)

{
  LexemeType LVar1;
  Lexeme *begin;
  Lexeme *pLVar2;
  int iVar3;
  SynForEachIterator *pSVar4;
  SynBase *this;
  undefined4 extraout_var;
  SynForEach *this_00;
  IntrusiveList<SynForEachIterator> iterators;
  IntrusiveList<SynForEachIterator> local_48;
  SynForEachIterator *local_38;
  SynForEachIterator *pSStack_30;
  undefined4 extraout_var_00;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_for) {
    ctx->currentLexeme = begin + 1;
    anon_unknown.dwarf_15b62::CheckConsume(ctx,lex_oparen,"ERROR: \'(\' not found after \'for\'");
    local_48.head = (SynForEachIterator *)0x0;
    local_48.tail = (SynForEachIterator *)0x0;
    pSVar4 = ParseForEachIterator(ctx,true);
    if (pSVar4 != (SynForEachIterator *)0x0) {
      IntrusiveList<SynForEachIterator>::push_back(&local_48,pSVar4);
      pLVar2 = ctx->currentLexeme;
      LVar1 = pLVar2->type;
      do {
        if (LVar1 != lex_comma) {
LAB_001175c2:
          anon_unknown.dwarf_15b62::CheckConsume
                    (ctx,lex_cparen,"ERROR: \')\' not found after \'for\' statement");
          this = ParseExpression(ctx);
          if (this == (SynBase *)0x0) {
            anon_unknown.dwarf_15b62::Report
                      (ctx,ctx->currentLexeme,"ERROR: body not found after \'for\' header");
            iVar3 = (*ctx->allocator->_vptr_Allocator[2])();
            this = (SynBase *)CONCAT44(extraout_var,iVar3);
            SynBase::SynBase(this,0,ctx->currentLexeme,ctx->currentLexeme);
            this->_vptr_SynBase = (_func_int **)&PTR__SynBase_00222408;
          }
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
          this_00 = (SynForEach *)CONCAT44(extraout_var_00,iVar3);
          if (ctx->firstLexeme < ctx->currentLexeme) {
            local_38 = local_48.head;
            pSStack_30 = local_48.tail;
            SynBase::SynBase((SynBase *)this_00,0x2a,begin,ctx->currentLexeme + -1);
            (this_00->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_00222de0;
            (this_00->iterators).head = local_38;
            (this_00->iterators).tail = pSStack_30;
            this_00->body = this;
            return this_00;
          }
          __assert_fail("currentLexeme > firstLexeme",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                        ,0x19c,"Lexeme *ParseContext::Previous()");
        }
        ctx->currentLexeme = pLVar2 + 1;
        pSVar4 = ParseForEachIterator(ctx,false);
        if (pSVar4 == (SynForEachIterator *)0x0) {
          anon_unknown.dwarf_15b62::Report
                    (ctx,ctx->currentLexeme,"ERROR: variable name or type expected before \'in\'");
          goto LAB_001175c2;
        }
        IntrusiveList<SynForEachIterator>::push_back(&local_48,pSVar4);
        pLVar2 = ctx->currentLexeme;
        LVar1 = pLVar2->type;
      } while( true );
    }
    ctx->currentLexeme = begin;
  }
  return (SynForEach *)0x0;
}

Assistant:

SynForEach* ParseForEach(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_for))
	{
		CheckConsume(ctx, lex_oparen, "ERROR: '(' not found after 'for'");

		IntrusiveList<SynForEachIterator> iterators;

		SynForEachIterator *iterator = ParseForEachIterator(ctx, true);

		if(!iterator)
		{
			// Backtrack
			ctx.currentLexeme = start;

			return NULL;
		}

		iterators.push_back(iterator);

		while(ctx.Consume(lex_comma))
		{
			iterator = ParseForEachIterator(ctx, false);

			if(!iterator)
			{
				Report(ctx, ctx.Current(), "ERROR: variable name or type expected before 'in'");

				break;
			}

			iterators.push_back(iterator);
		}

		CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after 'for' statement");

		SynBase *body = ParseExpression(ctx);

		if(!body)
		{
			Report(ctx, ctx.Current(), "ERROR: body not found after 'for' header");

			body = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		return new (ctx.get<SynForEach>()) SynForEach(start, ctx.Previous(), iterators, body);
	}

	return NULL;
}